

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xml_node __thiscall
pugi::xml_node::first_element_by_path(xml_node *this,char_t *path_,char_t delimiter)

{
  char *pcVar1;
  ulong uVar2;
  char cVar3;
  long lVar4;
  long lVar5;
  xml_node xVar6;
  char_t *pcVar7;
  xml_node *this_00;
  ulong uVar8;
  ulong uVar9;
  char_t *pcVar10;
  char_t *path__00;
  xml_node_struct *pxVar11;
  xml_node local_48;
  int local_3c;
  xml_node local_38;
  
  this_00 = &local_48;
  if (*path_ == delimiter) {
    pxVar11 = this->_root;
    if (pxVar11 == (xml_node_struct *)0x0) {
      local_48._root = (xml_node_struct *)0x0;
    }
    else {
      local_48._root =
           (xml_node_struct *)(*(long *)((long)pxVar11 - (pxVar11->header >> 8)) + -0x40);
    }
  }
  else {
    local_48 = (xml_node)this->_root;
  }
  if (local_48._root == (xml_node_struct *)0x0) {
LAB_00127729:
    xVar6._root = (xml_node_struct *)0x0;
  }
  else {
    pcVar10 = path_ + -3;
    do {
      pcVar7 = pcVar10;
      cVar3 = pcVar7[3];
      pcVar10 = pcVar7 + 1;
    } while (cVar3 == delimiter);
    uVar9 = 0;
    do {
      uVar8 = uVar9;
      uVar9 = uVar8 + 1;
      if (pcVar7[uVar8 + 3] == '\0') break;
    } while (pcVar7[uVar8 + 3] != delimiter);
    if (uVar9 == 1) {
      return (xml_node)local_48._root;
    }
    pcVar10 = pcVar7 + 1 + uVar9;
    do {
      path__00 = pcVar10 + 1;
      pcVar1 = pcVar10 + 1;
      pcVar10 = path__00;
    } while (*pcVar1 == delimiter);
    if (uVar9 != 2 || cVar3 != '.') {
      if (((cVar3 != '.') || (uVar9 != 3)) || (pcVar7[4] != '.')) {
        pxVar11 = (local_48._root)->first_child;
        if (pxVar11 != (xml_node_struct *)0x0) {
          local_3c = (int)delimiter;
          do {
            pcVar1 = pxVar11->name;
            if ((pcVar1 != (char *)0x0) && (*pcVar1 == pcVar7[3])) {
              uVar9 = 0;
              do {
                if (uVar8 - 1 == uVar9) goto LAB_001276fd;
                lVar4 = uVar9 + 1;
                uVar2 = uVar9 + 1;
                lVar5 = uVar9 + 4;
                uVar9 = uVar2;
              } while (pcVar1[lVar4] == pcVar7[lVar5]);
              if (uVar8 <= uVar2) {
LAB_001276fd:
                if ((pcVar1[uVar8] == '\0') &&
                   (local_38._root = pxVar11,
                   xVar6 = first_element_by_path(&local_38,path__00,(char_t)local_3c),
                   xVar6._root != (xml_node_struct *)0x0)) {
                  return (xml_node)xVar6._root;
                }
              }
            }
            pxVar11 = pxVar11->next_sibling;
          } while (pxVar11 != (xml_node_struct *)0x0);
        }
        goto LAB_00127729;
      }
      if (local_48._root == (xml_node_struct *)0x0) {
        local_38._root = (xml_node_struct *)0x0;
      }
      else {
        local_38._root = (local_48._root)->parent;
      }
      this_00 = &local_38;
    }
    xVar6 = first_element_by_path(this_00,path__00,delimiter);
  }
  return (xml_node)xVar6._root;
}

Assistant:

PUGI__FN xml_node xml_node::first_element_by_path(const char_t* path_, char_t delimiter) const
	{
		xml_node context = path_[0] == delimiter ? root() : *this;

		if (!context._root) return xml_node();

		const char_t* path_segment = path_;

		while (*path_segment == delimiter) ++path_segment;

		const char_t* path_segment_end = path_segment;

		while (*path_segment_end && *path_segment_end != delimiter) ++path_segment_end;

		if (path_segment == path_segment_end) return context;

		const char_t* next_segment = path_segment_end;

		while (*next_segment == delimiter) ++next_segment;

		if (*path_segment == '.' && path_segment + 1 == path_segment_end)
			return context.first_element_by_path(next_segment, delimiter);
		else if (*path_segment == '.' && *(path_segment+1) == '.' && path_segment + 2 == path_segment_end)
			return context.parent().first_element_by_path(next_segment, delimiter);
		else
		{
			for (xml_node_struct* j = context._root->first_child; j; j = j->next_sibling)
			{
				if (j->name && impl::strequalrange(j->name, path_segment, static_cast<size_t>(path_segment_end - path_segment)))
				{
					xml_node subsearch = xml_node(j).first_element_by_path(next_segment, delimiter);

					if (subsearch) return subsearch;
				}
			}

			return xml_node();
		}
	}